

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O3

void __thiscall
QPropertyAnimation::updateState(QPropertyAnimation *this,State newState,State oldState)

{
  QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
  *this_00;
  QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
  *__y;
  QPropertyAnimationPrivate *this_01;
  QObject *this_02;
  ulong uVar1;
  bool bVar2;
  parameter_type pVar3;
  int iVar4;
  State SVar5;
  parameter_type pQVar6;
  Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *pNVar7;
  parameter_type pQVar8;
  undefined4 extraout_var;
  char *pcVar9;
  ushort *puVar10;
  QAnimationGroup *pQVar11;
  QAbstractAnimation *this_03;
  char *pcVar12;
  QAbstractAnimation *current;
  long in_FS_OFFSET;
  bool bVar13;
  char *local_b0;
  char *local_a8;
  QString local_a0;
  pair<QObject_*,_QByteArray> local_88;
  unique_lock<QBasicMutex> local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QPropertyAnimationPrivate **)(this + 8);
  this_00 = &this_01->targetObject;
  pQVar6 = QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
           ::value(this_00);
  if (oldState == Stopped && pQVar6 == (parameter_type)0x0) {
    updateState((QPropertyAnimation *)this_01);
    goto LAB_003ab3b8;
  }
  QVariantAnimation::updateState((QVariantAnimation *)this,newState,oldState);
  local_68._M_device = &updateState::mutex;
  local_68._M_owns = false;
  local_68._9_7_ = 0xaaaaaaaaaaaaaa;
  std::unique_lock<QBasicMutex>::lock(&local_68);
  local_68._M_owns = true;
  if (updateState(QAbstractAnimation::State,QAbstractAnimation::State)::hash == '\0') {
    updateState();
  }
  __y = &this_01->propertyName;
  local_88.second.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_88.second.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.first = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.second.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  std::pair<QObject_*,_QByteArray>::
  pair<QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>_&,_QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>_&,_true>
            (&local_88,this_00,__y);
  if (newState == Running) {
    QPropertyAnimationPrivate::updateMetaProperty(this_01);
    if ((updateState::hash.d == (Data *)0x0) ||
       (pNVar7 = QHashPrivate::
                 Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>::
                 findNode<std::pair<QObject*,QByteArray>>
                           ((Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>
                             *)updateState::hash.d,&local_88),
       pNVar7 == (Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *)0x0)) {
      this_03 = (QAbstractAnimation *)0x0;
    }
    else {
      this_03 = (QAbstractAnimation *)pNVar7->value;
    }
    local_58.shared = (PrivateShared *)this;
    QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*>::emplace<QPropertyAnimation*const&>
              ((QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*> *)&updateState::hash,
               &local_88,(QPropertyAnimation **)&local_58.shared);
    std::unique_lock<QBasicMutex>::unlock(&local_68);
    if (oldState == Stopped) {
      QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
      ::value(this_00);
      this_02 = (this_00->super_QPropertyData<QObject_*>).val;
      pQVar8 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               ::value(__y);
      pcVar12 = (pQVar8->d).ptr;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = &QByteArray::_empty;
      }
      QObject::property((QVariant *)&local_58,this_02,pcVar12);
      QVariantAnimationPrivate::setDefaultStartEndValue
                (&this_01->super_QVariantAnimationPrivate,(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      QVariantAnimation::startValue((QVariant *)&local_58,(QVariantAnimation *)this);
      if (local_40 < (char *)0x4) {
        pVar3 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                ::value(&(this_01->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.
                         direction);
        if (pVar3 == Backward) {
          ::QVariant::~QVariant((QVariant *)&local_58);
        }
        else {
          uVar1 = *(ulong *)&(this_01->super_QVariantAnimationPrivate).defaultStartEndValue.d.
                             field_0x18;
          ::QVariant::~QVariant((QVariant *)&local_58);
          if (3 < uVar1) {
            local_b0 = (char *)0x0;
            bVar2 = true;
            local_a8 = "end";
            goto LAB_003ab243;
          }
        }
        local_b0 = "start";
        local_a8 = "start and end";
        bVar2 = false;
      }
      else {
        ::QVariant::~QVariant((QVariant *)&local_58);
        bVar2 = true;
        local_a8 = "end";
        local_b0 = (char *)0x0;
      }
LAB_003ab243:
      QVariantAnimation::endValue((QVariant *)&local_58,(QVariantAnimation *)this);
      if (local_40 < (char *)0x4) {
        pVar3 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                ::value(&(this_01->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.
                         direction);
        if (pVar3 == Forward) {
          ::QVariant::~QVariant((QVariant *)&local_58);
          local_b0 = local_a8;
        }
        else {
          uVar1 = *(ulong *)&(this_01->super_QVariantAnimationPrivate).defaultStartEndValue.d.
                             field_0x18;
          ::QVariant::~QVariant((QVariant *)&local_58);
          bVar13 = 3 < uVar1;
          if (!bVar13) {
            local_b0 = local_a8;
          }
          if ((bool)(bVar13 & bVar2)) goto LAB_003ab355;
        }
      }
      else {
        ::QVariant::~QVariant((QVariant *)&local_58);
        if (bVar2) goto LAB_003ab355;
      }
      local_58._0_4_ = 2;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_8_ = 0;
      local_58._20_4_ = 0;
      local_40 = "default";
      pQVar8 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               ::value(__y);
      pcVar12 = (pQVar8->d).ptr;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = &QByteArray::_empty;
      }
      QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
      ::value(this_00);
      iVar4 = (**((this_00->super_QPropertyData<QObject_*>).val)->_vptr_QObject)();
      pcVar9 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar4));
      QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
      ::value(this_00);
      QObject::objectName(&local_a0,(this_00->super_QPropertyData<QObject_*>).val);
      puVar10 = QString::utf16(&local_a0);
      QMessageLogger::warning
                ((QMessageLogger *)&local_58,
                 "QPropertyAnimation::updateState (%s, %s, %ls): starting an animation without %s value"
                 ,pcVar12,pcVar9,puVar10,local_b0);
      updateState((QPropertyAnimation *)&local_a0);
    }
  }
  else {
    if (((updateState::hash.d != (Data *)0x0) &&
        (pNVar7 = QHashPrivate::
                  Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>::
                  findNode<std::pair<QObject*,QByteArray>>
                            ((Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>
                              *)updateState::hash.d,&local_88),
        pNVar7 != (Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *)0x0)) &&
       ((QPropertyAnimation *)pNVar7->value == this)) {
      QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*>::
      removeImpl<std::pair<QObject*,QByteArray>>
                ((QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*> *)&updateState::hash,
                 &local_88);
    }
    this_03 = (QAbstractAnimation *)0x0;
  }
LAB_003ab355:
  if (&(local_88.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_88.second.d.d)->super_QArrayData,1,0x10);
    }
  }
  std::unique_lock<QBasicMutex>::~unique_lock(&local_68);
  if (this_03 != (QAbstractAnimation *)0x0) {
    while( true ) {
      pQVar11 = QAbstractAnimation::group(this_03);
      if (pQVar11 == (QAnimationGroup *)0x0) break;
      SVar5 = QAbstractAnimation::state(this_03);
      if (SVar5 == Stopped) break;
      this_03 = (QAbstractAnimation *)QAbstractAnimation::group(this_03);
    }
    QAbstractAnimation::stop(this_03);
  }
LAB_003ab3b8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyAnimation::updateState(QAbstractAnimation::State newState,
                                     QAbstractAnimation::State oldState)
{
    Q_D(QPropertyAnimation);

    if (!d->targetObject && oldState == Stopped) {
        qWarning("QPropertyAnimation::updateState (%s): Changing state of an animation without "
                 "target",
                 d->propertyName.value().constData());
        return;
    }

    QVariantAnimation::updateState(newState, oldState);

    QPropertyAnimation *animToStop = nullptr;
    {
        Q_CONSTINIT static QBasicMutex mutex;
        auto locker = qt_unique_lock(mutex);
        using QPropertyAnimationPair = std::pair<QObject *, QByteArray>;
        typedef QHash<QPropertyAnimationPair, QPropertyAnimation*> QPropertyAnimationHash;
        Q_CONSTINIT static QPropertyAnimationHash hash;

        // in case the targetObject gets deleted, the following happens:
        // 1. targetObject's destroyed signal calls our targetObjectDestroyed.
        // 2. targetObjectDestroyed calls stop()
        // 3. QAbstractAnimation::stop() calls setState(Stopped)
        // 4. setState(Stopped) calls updateState(newState, oldState)
        // 5. we arrive here. d->targetObject is not yet set to nullptr, we can safely use it.
        Q_ASSERT(d->targetObject);

        QPropertyAnimationPair key(d->targetObject, d->propertyName);
        if (newState == Running) {
            d->updateMetaProperty();
            animToStop = hash.value(key, nullptr);
            hash.insert(key, this);
            locker.unlock();
            // update the default start value
            if (oldState == Stopped) {
                d->setDefaultStartEndValue(
                        d->targetObject->property(d->propertyName.value().constData()));
                //let's check if we have a start value and an end value
                const char *what = nullptr;
                if (!startValue().isValid() && (d->direction == Backward || !d->defaultStartEndValue.isValid())) {
                    what = "start";
                }
                if (!endValue().isValid() && (d->direction == Forward || !d->defaultStartEndValue.isValid())) {
                    if (what)
                        what = "start and end";
                    else
                        what = "end";
                }
                if (Q_UNLIKELY(what)) {
                    qWarning("QPropertyAnimation::updateState (%s, %s, %ls): starting an animation "
                             "without %s value",
                             d->propertyName.value().constData(),
                             d->targetObject->metaObject()->className(),
                             qUtf16Printable(d->targetObject->objectName()), what);
                }
            }
        } else if (hash.value(key) == this) {
            hash.remove(key);
        }
    }

    //we need to do that after the mutex was unlocked
    if (animToStop) {
        // try to stop the top level group
        QAbstractAnimation *current = animToStop;
        while (current->group() && current->state() != Stopped)
            current = current->group();
        current->stop();
    }
}